

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_14::JUnitReporter::test_case_reenter(JUnitReporter *this,TestCaseData *in)

{
  char *file;
  long in_RSI;
  long in_RDI;
  string *classname;
  Timer *in_stack_ffffffffffffff40;
  JUnitTestCaseData *this_00;
  double in_stack_ffffffffffffff48;
  JUnitTestCaseData *in_stack_ffffffffffffff50;
  allocator<char> *__a;
  char *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  vector<doctest::String,_std::allocator<doctest::String>_> *in_stack_ffffffffffffff88;
  vector<doctest::String,_std::allocator<doctest::String>_> *in_stack_ffffffffffffff90;
  allocator<char> local_59 [17];
  vector<doctest::String,_std::allocator<doctest::String>_> *in_stack_ffffffffffffffb8;
  JUnitTestCaseData *in_stack_ffffffffffffffc0;
  allocator<char> local_28 [24];
  long local_10;
  
  local_10 = in_RSI;
  doctest::detail::Timer::getElapsedSeconds(in_stack_ffffffffffffff40);
  JUnitTestCaseData::addTime(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  __a = local_28;
  std::vector<doctest::String,_std::allocator<doctest::String>_>::vector
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  JUnitTestCaseData::appendSubcaseNamesToLastTestcase
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::vector<doctest::String,_std::allocator<doctest::String>_>::~vector
            ((vector<doctest::String,_std::allocator<doctest::String>_> *)in_stack_ffffffffffffff50)
  ;
  std::vector<doctest::String,_std::allocator<doctest::String>_>::clear
            ((vector<doctest::String,_std::allocator<doctest::String>_> *)0x77059c);
  doctest::detail::Timer::start(in_stack_ffffffffffffff40);
  file = (char *)(in_RDI + 0x98);
  String::c_str((String *)0x7705c7);
  skipPathFromFilename(file);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,__a);
  classname = *(string **)(local_10 + 0x20);
  this_00 = (JUnitTestCaseData *)&stack0xffffffffffffff7f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,__a);
  JUnitTestCaseData::add(this_00,classname,(string *)0x770641);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff7f);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(local_59);
  return;
}

Assistant:

void test_case_reenter(const TestCaseData& in) override {
            testCaseData.addTime(timer.getElapsedSeconds());
            testCaseData.appendSubcaseNamesToLastTestcase(deepestSubcaseStackNames);
            deepestSubcaseStackNames.clear();

            timer.start();
            testCaseData.add(skipPathFromFilename(in.m_file.c_str()), in.m_name);
        }